

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.h
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<float>::ReallocMatRed(TPZDohrSubstructCondense<float> *this)

{
  if (this->wasRealloc == false) {
    std::operator<<((ostream *)&std::cout,"TPZDohrSubstructCondense::ReallocMatRed\n");
    this->wasRealloc = true;
  }
  return;
}

Assistant:

void ReallocMatRed() 
		{
			if(!wasRealloc) {
				std::cout << "TPZDohrSubstructCondense::ReallocMatRed\n";
				fMatRed.ReallocForNuma(0);
                fMatRed->ReallocSolver();
				fMatRedComplete.ReallocForNuma(0);
                
				wasRealloc = true;
			}
		}